

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O3

void __thiscall Imf_2_5::CompositeDeepScanLine::Data::check_valid(Data *this,Header *header)

{
  pointer ppDVar1;
  pointer ppDVar2;
  Data *pDVar3;
  int iVar4;
  ChannelList *pCVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  undefined8 uVar8;
  ConstIterator CVar9;
  Header *this_00;
  Box2i *pBVar10;
  Box2i *pBVar11;
  ArgExc *this_01;
  bool bVar12;
  char *text;
  string n;
  allocator<char> local_5d;
  uint local_5c;
  Data *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = this;
  pCVar5 = Header::channels(header);
  cVar6._M_node = (_Base_ptr)ChannelList::begin(pCVar5);
  pCVar5 = Header::channels(header);
  cVar7._M_node = (_Base_ptr)ChannelList::end(pCVar5);
  if (cVar6._M_node != cVar7._M_node) {
    local_5c = 0;
    bVar12 = false;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,(char *)(cVar6._M_node + 1),&local_5d);
      iVar4 = std::__cxx11::string::compare((char *)local_50);
      if (iVar4 == 0) {
        local_58->_zback = true;
      }
      else {
        uVar8 = std::__cxx11::string::compare((char *)local_50);
        if ((int)uVar8 == 0) {
          local_5c = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)local_50);
          bVar12 = (bool)(bVar12 | iVar4 == 0);
        }
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
      pCVar5 = Header::channels(header);
      CVar9 = ChannelList::end(pCVar5);
      pDVar3 = local_58;
    } while ((const_iterator)cVar6._M_node != CVar9._i._M_node);
    if ((local_5c & 1) != 0) {
      if (bVar12) {
        ppDVar1 = (local_58->_part).
                  super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((local_58->_part).
            super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
            ._M_impl.super__Vector_impl_data._M_finish == ppDVar1) {
          ppDVar2 = (local_58->_file).
                    super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((local_58->_file).
              super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish == ppDVar2) {
            pBVar10 = Header::dataWindow(header);
            (pDVar3->_dataWindow).min = pBVar10->min;
            (pDVar3->_dataWindow).max = pBVar10->max;
            return;
          }
          this_00 = DeepScanLineInputFile::header(*ppDVar2);
        }
        else {
          this_00 = DeepScanLineInputPart::header(*ppDVar1);
        }
        pBVar10 = Header::displayWindow(this_00);
        pBVar11 = Header::displayWindow(header);
        if (((((pBVar10->min).x == (pBVar11->min).x) && ((pBVar10->min).y == (pBVar11->min).y)) &&
            ((pBVar10->max).x == (pBVar11->max).x)) && ((pBVar10->max).y == (pBVar11->max).y)) {
          pBVar10 = Header::dataWindow(header);
          iVar4 = (pBVar10->min).x;
          if (iVar4 < (pDVar3->_dataWindow).min.x) {
            (pDVar3->_dataWindow).min.x = iVar4;
          }
          iVar4 = (pBVar10->max).x;
          if ((pDVar3->_dataWindow).max.x < iVar4) {
            (pDVar3->_dataWindow).max.x = iVar4;
          }
          iVar4 = (pBVar10->min).y;
          if (iVar4 < (pDVar3->_dataWindow).min.y) {
            (pDVar3->_dataWindow).min.y = iVar4;
          }
          iVar4 = (pBVar10->max).y;
          if ((pDVar3->_dataWindow).max.y < iVar4) {
            (pDVar3->_dataWindow).max.y = iVar4;
          }
          return;
        }
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        text = 
        "Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data"
        ;
      }
      else {
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        text = "Deep data provided to CompositeDeepScanLine is missing an alpha channel";
      }
      goto LAB_00165565;
    }
  }
  this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
  text = "Deep data provided to CompositeDeepScanLine is missing a Z channel";
LAB_00165565:
  Iex_2_5::ArgExc::ArgExc(this_01,text);
  __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
CompositeDeepScanLine::Data::check_valid(const Header & header)
{

    bool has_z=false;
    bool has_alpha=false;
    // check good channel names
    for( ChannelList::ConstIterator i=header.channels().begin();i!=header.channels().end();++i)
    {
        std::string n(i.name()); 
        if(n=="ZBack")
        {
            _zback=true;
        }
        else if(n=="Z")
        {
            has_z=true;
        }
        else if(n=="A")
        {
            has_alpha=true;
        }
    }
    
    if(!has_z)
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine is missing a Z channel");
    }
    
    if(!has_alpha)
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine is missing an alpha channel");
    }
    
    
    if(_part.size()==0 && _file.size()==0)
    {
       // first in - update and return

       _dataWindow = header.dataWindow();
       
       return;
    }
    
    
    const Header * const match_header = _part.size()>0 ? &_part[0]->header() : &_file[0]->header();
    
    // check the sizes match
    if(match_header->displayWindow() != header.displayWindow())
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data");
    }
    
    _dataWindow.extendBy(header.dataWindow());
    
}